

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_frame_buffer_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1192fbd::ExternalFrameBufferNonRefTest::SetUp
          (ExternalFrameBufferNonRefTest *this)

{
  string sVar1;
  undefined8 *puVar2;
  CompressedVideoSource *pCVar3;
  AV1Decoder *pAVar4;
  pointer *__ptr;
  SEARCH_METHODS *pSVar5;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  AssertHelper local_50;
  undefined1 *local_48;
  undefined8 *local_40;
  undefined1 local_38 [16];
  
  pCVar3 = (CompressedVideoSource *)operator_new(0x48);
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"av1-1-b8-01-size-226x226.ivf","");
  pCVar3->_vptr_CompressedVideoSource = (_func_int **)&PTR__IVFVideoSource_0106a800;
  pCVar3[1]._vptr_CompressedVideoSource = (_func_int **)(pCVar3 + 3);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pCVar3 + 1),local_48,(undefined1 *)((long)local_40 + (long)local_48));
  *(undefined8 *)((long)&pCVar3[6]._vptr_CompressedVideoSource + 5) = 0;
  *(undefined8 *)((long)&pCVar3[7]._vptr_CompressedVideoSource + 5) = 0;
  pCVar3[5]._vptr_CompressedVideoSource = (_func_int **)0x0;
  pCVar3[6]._vptr_CompressedVideoSource = (_func_int **)0x0;
  (this->super_ExternalFrameBufferTest).video_ = pCVar3;
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<libaom_test::CompressedVideoSource*,decltype(nullptr)>
            ((internal *)&local_48,"video_","nullptr",&(this->super_ExternalFrameBufferTest).video_,
             &local_58._M_head_impl);
  sVar1 = local_48._0_1_;
  if (local_48._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (undefined8 *)0x0) {
      pSVar5 = "";
    }
    else {
      pSVar5 = (SEARCH_METHODS *)*local_40;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/external_frame_buffer_test.cc"
               ,0x184,(char *)pSVar5);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  puVar2 = local_40;
  if (local_40 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_40 != local_40 + 2) {
      operator_delete((undefined8 *)*local_40);
    }
    operator_delete(puVar2);
  }
  if (sVar1 != (string)0x0) {
    (*((this->super_ExternalFrameBufferTest).video_)->_vptr_CompressedVideoSource[2])();
    (*((this->super_ExternalFrameBufferTest).video_)->_vptr_CompressedVideoSource[3])();
    pAVar4 = (AV1Decoder *)operator_new(0x60);
    (pAVar4->super_Decoder).cfg_.h = 0;
    (pAVar4->super_Decoder).cfg_.allow_lowbitdepth = 1;
    (pAVar4->super_Decoder).flags_ = 0;
    (pAVar4->super_Decoder).init_done_ = false;
    (pAVar4->super_Decoder).decoder_.name = (char *)0x0;
    (pAVar4->super_Decoder).decoder_.iface = (aom_codec_iface_t *)0x0;
    *(undefined8 *)&(pAVar4->super_Decoder).decoder_.err = 0;
    (pAVar4->super_Decoder).decoder_.err_detail = (char *)0x0;
    (pAVar4->super_Decoder).decoder_.init_flags = 0;
    (pAVar4->super_Decoder).decoder_.config.dec = (aom_codec_dec_cfg *)0x0;
    (pAVar4->super_Decoder).decoder_.priv = (aom_codec_priv_t *)0x0;
    (pAVar4->super_Decoder).cfg_.threads = 0;
    (pAVar4->super_Decoder).cfg_.w = 0;
    (pAVar4->super_Decoder)._vptr_Decoder = (_func_int **)&PTR__Decoder_010373a8;
    (this->super_ExternalFrameBufferTest).decoder_ = pAVar4;
    local_58._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperNE<libaom_test::AV1Decoder*,decltype(nullptr)>
              ((internal *)&local_48,"decoder_","nullptr",
               &(this->super_ExternalFrameBufferTest).decoder_,&local_58._M_head_impl);
    if (local_48._0_1_ == (string)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_40 == (undefined8 *)0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = (SEARCH_METHODS *)*local_40;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/external_frame_buffer_test.cc"
                 ,0x18b,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_58._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_58._M_head_impl + 8))();
      }
    }
    if (local_40 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_40 != local_40 + 2) {
        operator_delete((undefined8 *)*local_40);
      }
      operator_delete(local_40);
    }
  }
  return;
}

Assistant:

void SetUp() override {
    video_ = new libaom_test::IVFVideoSource(kAV1NonRefTestFile);
    ASSERT_NE(video_, nullptr);
    video_->Init();
    video_->Begin();

    aom_codec_dec_cfg_t cfg = aom_codec_dec_cfg_t();
    cfg.allow_lowbitdepth = !FORCE_HIGHBITDEPTH_DECODING;
    decoder_ = new libaom_test::AV1Decoder(cfg, 0);
    ASSERT_NE(decoder_, nullptr);
  }